

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O3

Vector3d * opengv::generateRandomPointPlane(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int iVar6;
  Vector3d *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar4 = rand();
  iVar5 = rand();
  iVar6 = rand();
  auVar2 = vpinsrd_avx(ZEXT416(uVar4),iVar5,1);
  auVar2 = vcvtdq2pd_avx(auVar2);
  auVar7._8_8_ = 0x41dfffffffc00000;
  auVar7._0_8_ = 0x41dfffffffc00000;
  auVar7 = vdivpd_avx512vl(auVar2,auVar7);
  dVar1 = (double)iVar6 / 2147483647.0 + -0.5;
  auVar2._8_8_ = 0xbfe0000000000000;
  auVar2._0_8_ = 0xbfe0000000000000;
  auVar7 = vaddpd_avx512vl(auVar7,auVar2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1 + dVar1;
  auVar2 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar8,ZEXT816(0xc018000000000000));
  auVar9._0_8_ = auVar7._0_8_ + auVar7._0_8_;
  auVar9._8_8_ = auVar7._8_8_ + auVar7._8_8_;
  auVar3._8_8_ = 0x4018000000000000;
  auVar3._0_8_ = 0x4018000000000000;
  auVar7 = vmulpd_avx512vl(auVar9,auVar3);
  *(undefined1 (*) [16])
   (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
       auVar7;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
       auVar2._0_8_;
  return in_RDI;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomPointPlane()
{
  Eigen::Vector3d cleanPoint;
  cleanPoint[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;

  cleanPoint[0] = 6*cleanPoint[0];
  cleanPoint[1] = 6*cleanPoint[1];
  cleanPoint[2] = 2*cleanPoint[2]-6.0;

  return cleanPoint;
}